

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

int amqp_tcp_socket_open(void *base,char *host,int port,timeval *timeout)

{
  int iVar1;
  long in_RDI;
  int err;
  amqp_tcp_socket_t *self;
  timeval *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  undefined4 local_4;
  
  iVar1 = amqp_open_socket_noblock(in_stack_00000098,in_stack_00000094,in_stack_00000088);
  *(int *)(in_RDI + 8) = iVar1;
  if (*(int *)(in_RDI + 8) < 0) {
    local_4 = *(int *)(in_RDI + 8);
    *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
amqp_tcp_socket_open(void *base, const char *host, int port, struct timeval *timeout)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  self->sockfd = amqp_open_socket_noblock(host, port, timeout);
  if (0 > self->sockfd) {
    int err = self->sockfd;
    self->sockfd = -1;
    return err;
  }
  return AMQP_STATUS_OK;
}